

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltimerquery.cpp
# Opt level: O1

QList<unsigned_long> * __thiscall
QOpenGLTimeMonitorPrivate::samples
          (QList<unsigned_long> *__return_storage_ptr__,QOpenGLTimeMonitorPrivate *this)

{
  GLuint GVar1;
  QOpenGLQueryHelper *pQVar2;
  Data *pDVar3;
  pointer puVar4;
  long lVar5;
  long lVar6;
  
  if (this->ext == (QExtTimerQueryHelper *)0x0) {
    if (-1 < this->currentSample) {
      lVar5 = -1;
      lVar6 = 0;
      do {
        pQVar2 = this->core;
        GVar1 = (this->timers).d.ptr[lVar5 + 1];
        puVar4 = QList<unsigned_long>::data(&this->timeSamples);
        (*pQVar2->GetQueryObjectui64v)(GVar1,0x8866,(GLuint64 *)((long)puVar4 + lVar6));
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 8;
      } while (lVar5 < this->currentSample);
    }
  }
  else {
    samples();
  }
  pDVar3 = (this->timeSamples).d.d;
  (__return_storage_ptr__->d).d = pDVar3;
  (__return_storage_ptr__->d).ptr = (this->timeSamples).d.ptr;
  (__return_storage_ptr__->d).size = (this->timeSamples).d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<GLuint64> QOpenGLTimeMonitorPrivate::samples() const
{
    // For the Core and ARB options just ask for the timestamp for each timer query.
    // For the EXT implementation we cannot obtain timestamps so we defer any result
    // collection to the intervals() function
    if (!ext) {
        for (int i = 0; i <= currentSample; ++i)
            core->glGetQueryObjectui64v(timers.at(i), GL_QUERY_RESULT, &timeSamples[i]);
    } else {
        qWarning("QOpenGLTimeMonitor::samples() requires OpenGL >=3.3\n"
                 "or OpenGL 3.2 and GL_ARB_timer_query");
    }
    return timeSamples;
}